

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteBlif.c
# Opt level: O0

void Prs_ManWriteBlif(char *pFileName,Vec_Ptr_t *vPrs)

{
  int iVar1;
  Prs_Ntk_t *pPVar2;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  int local_2c;
  int i;
  FILE *pFile;
  Prs_Ntk_t *pNtk;
  Vec_Ptr_t *vPrs_local;
  char *pFileName_local;
  
  pPVar2 = Prs_ManRoot(vPrs);
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
  }
  else {
    pcVar3 = Prs_NtkStr(pPVar2,pPVar2->iModuleName);
    pcVar4 = Extra_TimeStamp();
    fprintf(__stream,"# Design \"%s\" written by ABC on %s\n\n",pcVar3,pcVar4);
    for (local_2c = 0; iVar1 = Vec_PtrSize(vPrs), local_2c < iVar1; local_2c = local_2c + 1) {
      pPVar2 = (Prs_Ntk_t *)Vec_PtrEntry(vPrs,local_2c);
      Prs_ManWriteBlifNtk((FILE *)__stream,pPVar2);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void Prs_ManWriteBlif( char * pFileName, Vec_Ptr_t * vPrs )
{
    Prs_Ntk_t * pNtk = Prs_ManRoot(vPrs);
    FILE * pFile = fopen( pFileName, "wb" ); int i;
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Design \"%s\" written by ABC on %s\n\n", Prs_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Prs_Ntk_t *, vPrs, pNtk, i )
        Prs_ManWriteBlifNtk( pFile, pNtk );
    fclose( pFile );
}